

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsvg.c
# Opt level: O0

FT_Error ft_svg_render(FT_Renderer_conflict renderer,FT_GlyphSlot slot,FT_Render_Mode mode,
                      FT_Vector *origin)

{
  FT_Renderer_Class *pFVar1;
  uchar *puVar2;
  SVG_RendererHooks hooks;
  FT_ULong size_image_buffer;
  FT_Memory pFStack_48;
  FT_Error error;
  FT_Memory memory;
  FT_Library library;
  SVG_Renderer svg_renderer;
  FT_Vector *origin_local;
  FT_GlyphSlot pFStack_20;
  FT_Render_Mode mode_local;
  FT_GlyphSlot slot_local;
  FT_Renderer_conflict renderer_local;
  
  memory = (FT_Memory)(renderer->root).library;
  pFStack_48 = ((FT_Library)memory)->memory;
  pFVar1 = renderer[1].clazz;
  if (mode == FT_RENDER_MODE_NORMAL) {
    if (*(char *)((long)&renderer[1].root.clazz + 1) == '\0') {
      renderer_local._4_4_ = 0x9e;
    }
    else {
      library = (FT_Library)renderer;
      svg_renderer = (SVG_Renderer)origin;
      origin_local._4_4_ = mode;
      pFStack_20 = slot;
      slot_local = (FT_GlyphSlot)renderer;
      if (*(char *)&renderer[1].root.clazz == '\0') {
        size_image_buffer._4_4_ = (*(code *)renderer[1].root.library)(&renderer[1].glyph_class);
        *(undefined1 *)(library->modules + 0xd) = 1;
      }
      ft_svg_preset_slot((FT_Module)slot_local,pFStack_20,'\x01');
      puVar2 = (uchar *)ft_mem_alloc(pFStack_48,
                                     (long)(pFStack_20->bitmap).pitch *
                                     (ulong)(pFStack_20->bitmap).rows,
                                     (FT_Error *)((long)&size_image_buffer + 4));
      (pFStack_20->bitmap).buffer = puVar2;
      if (size_image_buffer._4_4_ == 0) {
        size_image_buffer._4_4_ = (*(code *)pFVar1)(pFStack_20,library->modules + 0x12);
        if (size_image_buffer._4_4_ == 0) {
          pFStack_20->internal->flags = pFStack_20->internal->flags | 1;
        }
        else {
          ft_mem_free(pFStack_48,(pFStack_20->bitmap).buffer);
          (pFStack_20->bitmap).buffer = (uchar *)0x0;
        }
        renderer_local._4_4_ = size_image_buffer._4_4_;
      }
      else {
        renderer_local._4_4_ = size_image_buffer._4_4_;
      }
    }
  }
  else {
    renderer_local._4_4_ = 0x84;
  }
  return renderer_local._4_4_;
}

Assistant:

static FT_Error
  ft_svg_render( FT_Renderer       renderer,
                 FT_GlyphSlot      slot,
                 FT_Render_Mode    mode,
                 const FT_Vector*  origin )
  {
    SVG_Renderer  svg_renderer = (SVG_Renderer)renderer;

    FT_Library  library = renderer->root.library;
    FT_Memory   memory  = library->memory;
    FT_Error    error;

    FT_ULong  size_image_buffer;

    SVG_RendererHooks  hooks = svg_renderer->hooks;


    FT_UNUSED( mode );
    FT_UNUSED( origin );

    if ( mode != FT_RENDER_MODE_NORMAL )
      return FT_THROW( Bad_Argument );

    if ( svg_renderer->hooks_set == FALSE )
    {
      FT_TRACE1(( "Hooks are NOT set.  Can't render OT-SVG glyphs\n" ));
      return FT_THROW( Missing_SVG_Hooks );
    }

    if ( svg_renderer->loaded == FALSE )
    {
      FT_TRACE3(( "ft_svg_render: first rendering, calling init hook\n" ));
      error = hooks.init_svg( &svg_renderer->state );

      svg_renderer->loaded = TRUE;
    }

    ft_svg_preset_slot( (FT_Module)renderer, slot, TRUE );

    size_image_buffer = (FT_ULong)slot->bitmap.pitch * slot->bitmap.rows;
    /* No `FT_QALLOC` here since we need a clean, empty canvas */
    /* to start with.                                          */
    if ( FT_ALLOC( slot->bitmap.buffer, size_image_buffer ) )
      return error;

    error = hooks.render_svg( slot, &svg_renderer->state );
    if ( error )
      FT_FREE( slot->bitmap.buffer );
    else
      slot->internal->flags |= FT_GLYPH_OWN_BITMAP;

    return error;
  }